

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void MemHashLinkRecord(mem_hash_kv_engine *pEngine,mem_hash_record *pRecord)

{
  mem_hash_record *pmVar1;
  uint uVar2;
  mem_hash_record **ppmVar3;
  mem_hash_record **ppmVar4;
  
  uVar2 = pEngine->nBucket - 1 & pRecord->nHash;
  ppmVar4 = pEngine->apBucket;
  pmVar1 = ppmVar4[uVar2];
  pRecord->pNextHash = pmVar1;
  if (pmVar1 != (mem_hash_record *)0x0) {
    pmVar1->pPrevHash = pRecord;
  }
  ppmVar4[uVar2] = pRecord;
  ppmVar4 = &pEngine->pLast;
  if (pEngine->pFirst == (mem_hash_record *)0x0) {
    ppmVar3 = &pEngine->pFirst;
  }
  else {
    pmVar1 = *ppmVar4;
    ppmVar3 = ppmVar4;
    if (pmVar1 == (mem_hash_record *)0x0) goto LAB_00110d41;
    pRecord->pNext = pmVar1;
    ppmVar4 = &pmVar1->pPrev;
  }
  *ppmVar4 = pRecord;
LAB_00110d41:
  *ppmVar3 = pRecord;
  pEngine->nRecord = pEngine->nRecord + 1;
  return;
}

Assistant:

static void MemHashLinkRecord(mem_hash_kv_engine *pEngine,mem_hash_record *pRecord)
{
	sxu32 nBucket = pRecord->nHash & (pEngine->nBucket - 1);
	pRecord->pNextHash = pEngine->apBucket[nBucket];
	if( pEngine->apBucket[nBucket] ){
		pEngine->apBucket[nBucket]->pPrevHash = pRecord;
	}
	pEngine->apBucket[nBucket] = pRecord;
	if( pEngine->pFirst == 0 ){
		pEngine->pFirst = pEngine->pLast = pRecord;
	}else{
		MACRO_LD_PUSH(pEngine->pLast,pRecord);
	}
	pEngine->nRecord++;
}